

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnviewgrip.cpp
# Opt level: O1

void __thiscall QColumnViewGrip::mousePressEvent(QColumnViewGrip *this,QMouseEvent *event)

{
  long lVar1;
  double dVar2;
  double dVar3;
  
  lVar1 = *(long *)(this + 8);
  dVar2 = (double)QEventPoint::globalPosition();
  dVar2 = (double)((ulong)dVar2 & 0x8000000000000000 | (ulong)DAT_0066f5c0) + dVar2;
  dVar3 = 2147483647.0;
  if (dVar2 <= 2147483647.0) {
    dVar3 = dVar2;
  }
  if (dVar3 <= -2147483648.0) {
    dVar3 = -2147483648.0;
  }
  *(int *)(lVar1 + 0x254) = (int)dVar3;
  event[0xc] = (QMouseEvent)0x1;
  return;
}

Assistant:

void QColumnViewGrip::mousePressEvent(QMouseEvent *event)
{
    Q_D(QColumnViewGrip);
    d->originalXLocation = event->globalPosition().toPoint().x();
    event->accept();
}